

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O3

bool __thiscall cornelich::excerpt_tailer::next_index(excerpt_tailer *this)

{
  uint uVar1;
  int32_t iVar2;
  char *pcVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar4;
  long lVar5;
  char *__s;
  
  lVar5 = this->m_index;
  if (lVar5 < 0) {
    uVar1 = vanilla_index::find_first_cycle(&this->m_chronicle->m_index);
    if ((int)uVar1 < 0) {
      lVar5 = this->m_index;
    }
    else {
      lVar5 = (ulong)uVar1 * (this->m_chronicle->m_settings).m_entries_per_cycle + -1;
      this->m_index = lVar5;
    }
    in_RDX = extraout_RDX;
    if (lVar5 < 0) {
      return false;
    }
  }
  __s = (char *)(lVar5 + 1);
  while( true ) {
    pcVar3 = index(this,__s,(int)in_RDX);
    if ((char)pcVar3 != '\0') {
      this->m_index = (int64_t)__s;
      return true;
    }
    lVar5 = (this->m_chronicle->m_settings).m_entries_per_cycle;
    iVar2 = cycle_for_now((this->m_chronicle->m_settings).m_cycle_length);
    iVar4 = (int)((long)__s / lVar5);
    if (iVar2 < iVar4) break;
    __s = (char *)((long)(iVar4 + 1) * (this->m_chronicle->m_settings).m_entries_per_cycle);
    in_RDX = extraout_RDX_00;
  }
  return false;
}

Assistant:

bool excerpt_tailer::next_index()
{
    if(m_index < 0)
    {
        to_start();
        if(m_index < 0)
            return false;
    }

    auto next = m_index + 1;
    while(true)
    {
        auto found = index(next);
        if(found)
        {
            m_index = next;
            return true;
        }

        auto cycle = static_cast<std::int32_t>(next / m_chronicle.m_settings.entries_per_cycle());
        if(cycle > cycle_for_now(m_chronicle.m_settings.cycle_length()))
            return false;
        next = (cycle + 1) * m_chronicle.m_settings.entries_per_cycle();
    }
}